

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O0

void __thiscall
btSoftBody::appendAnchor
          (btSoftBody *this,int node,btRigidBody *body,btVector3 *localPivot,
          bool disableCollisionBetweenLinkedBodies,btScalar influence)

{
  int iVar1;
  Node *this_00;
  int in_ESI;
  Anchor *in_RDI;
  byte in_R8B;
  Anchor a;
  undefined4 in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  btAlignedObjectArray<const_btCollisionObject_*> *in_stack_ffffffffffffff60;
  
  if ((in_R8B & 1) != 0) {
    in_stack_ffffffffffffff54 =
         btAlignedObjectArray<const_btCollisionObject_*>::findLinearSearch
                   (in_stack_ffffffffffffff60,(btCollisionObject **)in_RDI);
    iVar1 = btAlignedObjectArray<const_btCollisionObject_*>::size
                      ((btAlignedObjectArray<const_btCollisionObject_*> *)&in_RDI[3].m_body);
    if (in_stack_ffffffffffffff54 == iVar1) {
      btAlignedObjectArray<const_btCollisionObject_*>::push_back
                (in_stack_ffffffffffffff60,(btCollisionObject **)in_RDI);
    }
  }
  Anchor::Anchor((Anchor *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  this_00 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                      ((btAlignedObjectArray<btSoftBody::Node> *)
                       (in_RDI[8].m_c0.m_el[0].m_floats + 3),in_ESI);
  this_00->field_0x70 = this_00->field_0x70 & 0xfe | 1;
  btAlignedObjectArray<btSoftBody::Anchor>::push_back
            ((btAlignedObjectArray<btSoftBody::Anchor> *)this_00,in_RDI);
  return;
}

Assistant:

void			btSoftBody::appendAnchor(int node,btRigidBody* body, const btVector3& localPivot,bool disableCollisionBetweenLinkedBodies,btScalar influence)
{
	if (disableCollisionBetweenLinkedBodies)
	{
		if (m_collisionDisabledObjects.findLinearSearch(body)==m_collisionDisabledObjects.size())
		{
			m_collisionDisabledObjects.push_back(body);
		}
	}

	Anchor	a;
	a.m_node			=	&m_nodes[node];
	a.m_body			=	body;
	a.m_local			=	localPivot;
	a.m_node->m_battach	=	1;
	a.m_influence = influence;
	m_anchors.push_back(a);
}